

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O1

void __thiscall HEkkPrimal::chooseColumn(HEkkPrimal *this,bool hyper_sparse)

{
  double dVar1;
  int iVar2;
  HEkk *pHVar3;
  pointer pdVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pcVar7;
  undefined7 in_register_00000031;
  long lVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  
  pHVar3 = this->ekk_instance_;
  this->variable_in = -1;
  if ((int)CONCAT71(in_register_00000031,hyper_sparse) == 0) {
    HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x29,0);
    lVar9 = (long)(this->nonbasic_free_col_set).count_;
    if (lVar9 < 1) {
      dVar10 = 0.0;
    }
    else {
      piVar5 = (this->nonbasic_free_col_set).entry_.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pdVar4 = (pHVar3->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data._M_start;
      pdVar6 = (this->edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar10 = 0.0;
      lVar8 = 0;
      do {
        iVar2 = piVar5[lVar8];
        dVar11 = pdVar4[iVar2];
        if (this->dual_feasibility_tolerance < ABS(dVar11)) {
          dVar1 = pdVar6[iVar2];
          if (dVar10 * dVar1 < dVar11 * dVar11) {
            this->variable_in = iVar2;
            dVar10 = (dVar11 * dVar11) / dVar1;
          }
        }
        lVar8 = lVar8 + 1;
      } while (lVar9 != lVar8);
    }
    if (0 < (long)this->num_tot) {
      pcVar7 = (pHVar3->basis_).nonbasicMove_.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (pHVar3->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data._M_start;
      pdVar6 = (this->edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar9 = 0;
      do {
        dVar11 = (double)-(int)pcVar7[lVar9] * pdVar4[lVar9];
        if (this->dual_feasibility_tolerance < dVar11) {
          dVar1 = pdVar6[lVar9];
          if (dVar10 * dVar1 < dVar11 * dVar11) {
            this->variable_in = (HighsInt)lVar9;
            dVar10 = (dVar11 * dVar11) / dVar1;
          }
        }
        lVar9 = lVar9 + 1;
      } while (this->num_tot != lVar9);
    }
    HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x29,0);
    return;
  }
  if (this->initialise_hyper_chuzc == false) {
    hyperChooseColumn(this);
  }
  if (this->initialise_hyper_chuzc == true) {
    HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x2a,0);
    this->num_hyper_chuzc_candidates = 0;
    if (((this->nonbasic_free_col_set).count_ != 0) && (0 < (this->nonbasic_free_col_set).count_)) {
      lVar9 = 0;
      do {
        iVar2 = (this->nonbasic_free_col_set).entry_.super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar9];
        dVar10 = (pHVar3->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[iVar2];
        if (this->dual_feasibility_tolerance <= ABS(dVar10) &&
            ABS(dVar10) != this->dual_feasibility_tolerance) {
          addToDecreasingHeap(&this->num_hyper_chuzc_candidates,this->max_num_hyper_chuzc_candidates
                              ,&this->hyper_chuzc_measure,&this->hyper_chuzc_candidate,
                              (dVar10 * dVar10) /
                              (this->edge_weight_).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[iVar2],iVar2);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < (this->nonbasic_free_col_set).count_);
    }
    if (0 < this->num_tot) {
      lVar9 = 0;
      do {
        dVar10 = (double)-(int)(pHVar3->basis_).nonbasicMove_.
                               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
                               .super__Vector_impl_data._M_start[lVar9] *
                 (pHVar3->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar9];
        if (this->dual_feasibility_tolerance <= dVar10 && dVar10 != this->dual_feasibility_tolerance
           ) {
          addToDecreasingHeap(&this->num_hyper_chuzc_candidates,this->max_num_hyper_chuzc_candidates
                              ,&this->hyper_chuzc_measure,&this->hyper_chuzc_candidate,
                              (dVar10 * dVar10) /
                              (this->edge_weight_).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar9],(HighsInt)lVar9);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < this->num_tot);
    }
    sortDecreasingHeap(this->num_hyper_chuzc_candidates,&this->hyper_chuzc_measure,
                       &this->hyper_chuzc_candidate);
    this->initialise_hyper_chuzc = false;
    HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x2a,0);
    if ((long)this->num_hyper_chuzc_candidates != 0) {
      pdVar4 = (this->hyper_chuzc_measure).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      this->variable_in =
           (this->hyper_chuzc_candidate).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[1];
      dVar10 = pdVar4[1];
      this->max_hyper_chuzc_non_candidate_measure = pdVar4[this->num_hyper_chuzc_candidates];
      if (this->report_hyper_chuzc == true) {
        printf("Full CHUZC: Max         measure is %9.4g for column %4d, and max non-candidate measure of  %9.4g\n"
               ,dVar10);
        return;
      }
    }
  }
  return;
}

Assistant:

void HEkkPrimal::chooseColumn(const bool hyper_sparse) {
  assert(!hyper_sparse || !done_next_chuzc);
  const vector<int8_t>& nonbasicMove = ekk_instance_.basis_.nonbasicMove_;
  const vector<double>& workDual = ekk_instance_.info_.workDual_;
  double best_measure = 0;
  variable_in = -1;

  const bool local_use_hyper_chuzc = hyper_sparse;
  // Consider nonbasic free columns first
  const HighsInt& num_nonbasic_free_col = nonbasic_free_col_set.count();
  if (local_use_hyper_chuzc) {
    if (!initialise_hyper_chuzc) hyperChooseColumn();
    if (initialise_hyper_chuzc) {
      analysis->simplexTimerStart(ChuzcHyperInitialiselClock);
      num_hyper_chuzc_candidates = 0;
      if (num_nonbasic_free_col) {
        const vector<HighsInt>& nonbasic_free_col_set_entry =
            nonbasic_free_col_set.entry();
        for (HighsInt ix = 0; ix < num_nonbasic_free_col; ix++) {
          HighsInt iCol = nonbasic_free_col_set_entry[ix];
          double dual_infeasibility = fabs(workDual[iCol]);
          if (dual_infeasibility > dual_feasibility_tolerance) {
            double measure =
                dual_infeasibility * dual_infeasibility / edge_weight_[iCol];
            addToDecreasingHeap(
                num_hyper_chuzc_candidates, max_num_hyper_chuzc_candidates,
                hyper_chuzc_measure, hyper_chuzc_candidate, measure, iCol);
          }
        }
      }
      // Now look at other columns
      for (HighsInt iCol = 0; iCol < num_tot; iCol++) {
        double dual_infeasibility = -nonbasicMove[iCol] * workDual[iCol];
        if (dual_infeasibility > dual_feasibility_tolerance) {
          double measure =
              dual_infeasibility * dual_infeasibility / edge_weight_[iCol];
          addToDecreasingHeap(
              num_hyper_chuzc_candidates, max_num_hyper_chuzc_candidates,
              hyper_chuzc_measure, hyper_chuzc_candidate, measure, iCol);
        }
      }
      // Sort the heap
      sortDecreasingHeap(num_hyper_chuzc_candidates, hyper_chuzc_measure,
                         hyper_chuzc_candidate);
      initialise_hyper_chuzc = false;
      analysis->simplexTimerStop(ChuzcHyperInitialiselClock);
      // Choose the first entry - if there is one
      if (num_hyper_chuzc_candidates) {
        variable_in = hyper_chuzc_candidate[1];
        best_measure = hyper_chuzc_measure[1];
        max_hyper_chuzc_non_candidate_measure =
            hyper_chuzc_measure[num_hyper_chuzc_candidates];
        if (report_hyper_chuzc)
          printf(
              "Full CHUZC: Max         measure is %9.4g for column "
              "%4" HIGHSINT_FORMAT
              ", and "
              "max non-candidate measure of  %9.4g\n",
              best_measure, variable_in, max_hyper_chuzc_non_candidate_measure);
      }
    }
  } else {
    analysis->simplexTimerStart(ChuzcPrimalClock);
    // Choose any attractive nonbasic free column
    if (num_nonbasic_free_col) {
      const vector<HighsInt>& nonbasic_free_col_set_entry =
          nonbasic_free_col_set.entry();
      for (HighsInt ix = 0; ix < num_nonbasic_free_col; ix++) {
        HighsInt iCol = nonbasic_free_col_set_entry[ix];
        double dual_infeasibility = fabs(workDual[iCol]);
        if (dual_infeasibility > dual_feasibility_tolerance &&
            dual_infeasibility * dual_infeasibility >
                best_measure * edge_weight_[iCol]) {
          variable_in = iCol;
          best_measure =
              dual_infeasibility * dual_infeasibility / edge_weight_[iCol];
        }
      }
    }
    // Now look at other columns
    for (HighsInt iCol = 0; iCol < num_tot; iCol++) {
      double dual_infeasibility = -nonbasicMove[iCol] * workDual[iCol];
      if (dual_infeasibility > dual_feasibility_tolerance &&
          dual_infeasibility * dual_infeasibility >
              best_measure * edge_weight_[iCol]) {
        variable_in = iCol;
        best_measure =
            dual_infeasibility * dual_infeasibility / edge_weight_[iCol];
      }
    }
    analysis->simplexTimerStop(ChuzcPrimalClock);
  }
  //  printf("ChooseColumn: Iteration %" HIGHSINT_FORMAT ", choose column %"
  //  HIGHSINT_FORMAT " with measure %g\n",
  //	 ekk_instance_.iteration_count_, variable_in, best_measure);
}